

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

String __thiscall Bstrlib::String::extractToken(String *this,char c,int *pos)

{
  int *in_RCX;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *puVar1;
  undefined7 in_register_00000031;
  String *this_00;
  String SVar2;
  String local_48;
  int local_34;
  int findNextPos;
  int *local_28;
  int *pos_local;
  String *pSStack_18;
  char c_local;
  String *this_local;
  String *ret;
  
  this_00 = (String *)CONCAT71(in_register_00000031,c);
  pos_local._7_1_ = (char)pos;
  findNextPos._3_1_ = 0;
  local_28 = in_RCX;
  pSStack_18 = this_00;
  this_local = this;
  String(this);
  puVar1 = extraout_RDX;
  if (*local_28 < (this_00->super_tagbstring).slen) {
    local_34 = Find(this_00,pos_local._7_1_,*local_28);
    if (local_34 == -1) {
      local_34 = (this_00->super_tagbstring).slen;
    }
    midString(&local_48,(int)this_00,*local_28);
    operator=(this,&local_48);
    ~String(&local_48);
    *local_28 = local_34 + 1;
    puVar1 = extraout_RDX_00;
  }
  SVar2.super_tagbstring.data = puVar1;
  SVar2.super_tagbstring._0_8_ = this;
  return (String)SVar2.super_tagbstring;
}

Assistant:

String String::extractToken(char c, int & pos) const
    {
        String ret;
        if (pos >= slen) return ret;

        int findNextPos = Find(c, pos);
        if (findNextPos == -1) findNextPos = slen;
        ret = midString(pos, findNextPos - pos);
        pos = findNextPos + 1;
        return ret;
    }